

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O2

void __thiscall Dense::~Dense(Dense *this)

{
  ostream *poVar1;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_00130928;
  poVar1 = std::operator<<((ostream *)&std::cout,"Object deconstructed!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&this->type);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->last_input);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->activation);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->biases);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->weigths);
  return;
}

Assistant:

Dense::~Dense() {
    cout << "Object deconstructed!" << endl;
}